

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExpressionSyntax *args_2;
  ConstraintBlockSyntax *args_1;
  ArrayOrRandomizeMethodExpressionSyntax *pAVar1;
  Token TVar2;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  ConstraintBlockSyntax *in_stack_ffffffffffffffb0;
  ParenExpressionListSyntax *local_48;
  BumpAllocator *this;
  
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x93fbe6);
  args_2 = deepClone<slang::syntax::ExpressionSyntax>
                     ((ExpressionSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  this = TVar2._0_8_;
  if (*(long *)(__fn + 0x30) == 0) {
    local_48 = (ParenExpressionListSyntax *)0x0;
  }
  else {
    local_48 = deepClone<slang::syntax::ParenExpressionListSyntax>
                         ((ParenExpressionListSyntax *)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
  }
  if (*(long *)(__fn + 0x38) == 0) {
    args_1 = (ConstraintBlockSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::ConstraintBlockSyntax>
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::ArrayOrRandomizeMethodExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ParenExpressionListSyntax*,slang::syntax::ConstraintBlockSyntax*>
                     (this,(ExpressionSyntax *)local_48,(Token *)args_1,
                      (ParenExpressionListSyntax **)args_2,(ConstraintBlockSyntax **)__child_stack);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const ArrayOrRandomizeMethodExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ArrayOrRandomizeMethodExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.method, alloc),
        node.with.deepClone(alloc),
        node.args ? deepClone(*node.args, alloc) : nullptr,
        node.constraints ? deepClone(*node.constraints, alloc) : nullptr
    );
}